

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  size_type sVar5;
  uint uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined7 extraout_var;
  char *pcVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  long lVar14;
  char *pcVar15;
  LinkClosure *pLVar16;
  long *plVar17;
  size_type *psVar18;
  byte bVar19;
  pointer pbVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  bool bVar24;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar25;
  string d;
  string suffix;
  string rootPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  uint local_148;
  allocator local_143;
  allocator local_142;
  allocator local_141;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  char *local_130;
  undefined1 local_128 [32];
  _Base_ptr local_108;
  size_t local_100;
  char *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = this->Makefile;
  local_138 = runtimeDirs;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CMAKE_SKIP_RPATH","");
  bVar8 = cmMakefile::IsOn(pcVar2,(string *)local_128);
  bVar24 = (this->RuntimeFlag)._M_string_length != 0;
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  uVar23 = CONCAT71((int7)((ulong)pcVar2 >> 8),1);
  if (!for_install) {
    pcVar3 = this->Target;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"BUILD_WITH_INSTALL_RPATH","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_50);
    uVar23 = CONCAT71(extraout_var,bVar9) & 0xffffffff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (!bVar8 && bVar24) {
    bVar9 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    bVar19 = bVar9 & (byte)uVar23;
    bVar9 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    uVar21 = CONCAT71((int7)((uVar23 & 0xffffffff) >> 8),((byte)(uVar23 & 0xffffffff) ^ 1) & bVar9);
  }
  else {
    bVar19 = 0;
    uVar21 = 0;
  }
  bVar22 = (byte)uVar23 ^ 1;
  if ((!bVar8 && bVar24) && bVar22 == 0) {
    pcVar2 = this->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar9 = cmMakefile::IsOn(pcVar2,&local_70);
    if (!bVar9) {
      pcVar3 = this->Target;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"INSTALL_RPATH_USE_LINK_PATH","");
      bVar10 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_90);
      bVar9 = true;
      goto LAB_002f6078;
    }
  }
  bVar9 = false;
  bVar10 = false;
LAB_002f6078:
  if ((bVar9) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (((!bVar8 && bVar24) && bVar22 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_128._24_8_ = local_128 + 8;
  local_128._8_4_ = _S_red;
  local_128._16_8_ = 0;
  local_100 = 0;
  local_108 = (_Base_ptr)local_128._24_8_;
  if (bVar19 != 0) {
    pcVar3 = this->Target;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"INSTALL_RPATH","");
    pcVar12 = cmGeneratorTarget::GetProperty(pcVar3,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    cmCLI_ExpandListUnique
              (pcVar12,local_138,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128);
  }
  paVar1 = &local_1a8.field_2;
  if ((byte)((byte)uVar21 | bVar10) == 1) {
    pcVar2 = this->Makefile;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"CMAKE_SYSROOT","");
    pcVar12 = cmMakefile::GetSafeDefinition(pcVar2,&local_1a8);
    std::__cxx11::string::string((string *)&local_168,pcVar12,(allocator *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"CMAKE_STAGING_PREFIX","");
    pcVar12 = cmMakefile::GetDefinition(pcVar2,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"CMAKE_INSTALL_PREFIX","");
    local_130 = cmMakefile::GetSafeDefinition(pcVar2,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_168);
    pvVar13 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this->OrderRuntimeSearchPath);
    pbVar20 = (pvVar13->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (uint)uVar21;
    pvVar7 = pvVar13;
    pcVar15 = pcVar12;
    if (pbVar20 !=
        (pvVar13->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_f8 = pcVar15;
        local_140 = pvVar7;
        local_148 = uVar6;
        if ((char)uVar21 == '\0') {
          if (bVar10 != false) {
            pcVar12 = cmake::GetHomeDirectory(this->CMakeInstance);
            pcVar15 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
            std::__cxx11::string::string((string *)&local_1a8,pcVar12,(allocator *)&local_188);
            bVar8 = cmsys::SystemTools::ComparePath(pbVar20,&local_1a8);
            if (bVar8) {
LAB_002f6443:
              bVar24 = false;
LAB_002f6446:
              bVar9 = false;
              bVar11 = false;
            }
            else {
              std::__cxx11::string::string((string *)&local_b0,pcVar15,&local_141);
              bVar24 = cmsys::SystemTools::ComparePath(pbVar20,&local_b0);
              if (bVar24) goto LAB_002f6443;
              std::__cxx11::string::string((string *)&local_d0,pcVar12,&local_142);
              bVar24 = cmsys::SystemTools::IsSubDirectory(pbVar20,&local_d0);
              if (bVar24) {
                bVar24 = true;
                goto LAB_002f6446;
              }
              std::__cxx11::string::string((string *)&local_f0,pcVar15,&local_143);
              bVar11 = cmsys::SystemTools::IsSubDirectory(pbVar20,&local_f0);
              bVar11 = !bVar11;
              bVar24 = true;
              bVar9 = true;
            }
            if ((bVar9) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            pcVar12 = local_f8;
            uVar21 = (ulong)local_148;
            if ((bVar24) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            pvVar13 = local_140;
            if ((!bVar8) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar11) {
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              pcVar4 = (pbVar20->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a8,pcVar4,pcVar4 + pbVar20->_M_string_length);
              if ((local_168._M_string_length == 0) ||
                 (lVar14 = std::__cxx11::string::find
                                     ((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p,0),
                 lVar14 != 0)) {
                if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
                  strlen(pcVar12);
                  lVar14 = std::__cxx11::string::find((char *)&local_1a8,(ulong)pcVar12,0);
                  if (lVar14 == 0) {
                    strlen(pcVar12);
                    std::__cxx11::string::substr((ulong)&local_188,(ulong)&local_1a8);
                    pcVar15 = local_130;
                    sVar5 = local_1a8._M_string_length;
                    strlen(local_130);
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_1a8,0,(char *)sVar5,(ulong)pcVar15);
                    std::__cxx11::string::append((char *)&local_1a8);
                    std::__cxx11::string::_M_append
                              ((char *)&local_1a8,(ulong)local_188._M_dataplus._M_p);
                    cmsys::SystemTools::ConvertToUnixSlashes(&local_1a8);
                    pvVar13 = local_140;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      local_188.field_2._M_allocated_capacity + 1);
                    }
                    uVar21 = (ulong)local_148;
                  }
                }
              }
              else {
                std::__cxx11::string::substr((ulong)&local_188,(ulong)&local_1a8);
                std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_188);
                pvVar13 = local_140;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                  pvVar13 = local_140;
                }
              }
              pVar25 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)local_128,&local_1a8);
              if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(local_138,&local_1a8);
              }
              goto LAB_002f669f;
            }
          }
        }
        else {
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          pcVar4 = (pbVar20->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,pcVar4,pcVar4 + pbVar20->_M_string_length);
          if ((local_168._M_string_length == 0) ||
             (lVar14 = std::__cxx11::string::find
                                 ((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p,0),
             lVar14 != 0)) {
            if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
              strlen(pcVar12);
              lVar14 = std::__cxx11::string::find((char *)&local_1a8,(ulong)pcVar12,0);
              if (lVar14 == 0) {
                strlen(pcVar12);
                std::__cxx11::string::substr((ulong)&local_188,(ulong)&local_1a8);
                pcVar15 = local_130;
                sVar5 = local_1a8._M_string_length;
                strlen(local_130);
                std::__cxx11::string::_M_replace((ulong)&local_1a8,0,(char *)sVar5,(ulong)pcVar15);
                std::__cxx11::string::append((char *)&local_1a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1a8,(ulong)local_188._M_dataplus._M_p);
                cmsys::SystemTools::ConvertToUnixSlashes(&local_1a8);
                pvVar13 = local_140;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
                uVar21 = (ulong)local_148;
              }
            }
          }
          else {
            std::__cxx11::string::substr((ulong)&local_188,(ulong)&local_1a8);
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_188);
            pvVar13 = local_140;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
              pvVar13 = local_140;
            }
          }
          pVar25 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_128,&local_1a8);
          if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_138,&local_1a8);
          }
LAB_002f669f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar20 = pbVar20 + 1;
        uVar6 = local_148;
        pvVar7 = local_140;
        pcVar15 = local_f8;
      } while (pbVar20 !=
               (pvVar13->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  pLVar16 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  pbVar20 = (pLVar16->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar20 !=
      (pLVar16->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_1a8,"CMAKE_",pbVar20);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar18 = (size_type *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_168.field_2._M_allocated_capacity = *psVar18;
        local_168.field_2._8_8_ = plVar17[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar18;
        local_168._M_dataplus._M_p = (pointer)*plVar17;
      }
      local_168._M_string_length = plVar17[1];
      *plVar17 = (long)psVar18;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      bVar8 = cmMakefile::IsOn(this->Makefile,&local_168);
      if (bVar8) {
        std::operator+(&local_188,"CMAKE_",pbVar20);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        psVar18 = (size_type *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_1a8.field_2._M_allocated_capacity = *psVar18;
          local_1a8.field_2._8_8_ = plVar17[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar18;
          local_1a8._M_dataplus._M_p = (pointer)*plVar17;
        }
        local_1a8._M_string_length = plVar17[1];
        *plVar17 = (long)psVar18;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        pcVar12 = cmMakefile::GetDefinition(this->Makefile,&local_1a8);
        if (pcVar12 != (char *)0x0) {
          cmCLI_ExpandListUnique
                    (pcVar12,local_138,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_128);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             (pLVar16->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmCLI_ExpandListUnique
            ((this->RuntimeAlways)._M_dataplus._M_p,local_138,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install)
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath =
    outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Construct the RPATH.
  std::set<std::string> emitted;
  if(use_install_rpath)
    {
    const char* install_rpath =
        this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
    }
  if(use_build_rpath || use_link_rpath)
    {
    std::string rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    const char *stagePath
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    const char *installPrefix
                  = this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    for(std::vector<std::string>::const_iterator ri = rdirs.begin();
        ri != rdirs.end(); ++ri)
      {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if(use_build_rpath)
        {
        std::string d = *ri;
        if (!rootPath.empty() && d.find(rootPath) == 0)
          {
          d = d.substr(rootPath.size());
          }
        else if (stagePath && *stagePath && d.find(stagePath) == 0)
          {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
          }
        if(emitted.insert(d).second)
          {
          runtimeDirs.push_back(d);
          }
        }
      else if(use_link_rpath)
        {
        // Do not add any path inside the source or build tree.
        const char* topSourceDir = this->CMakeInstance->GetHomeDirectory();
        const char* topBinaryDir =
            this->CMakeInstance->GetHomeOutputDirectory();
        if(!cmSystemTools::ComparePath(*ri, topSourceDir) &&
           !cmSystemTools::ComparePath(*ri, topBinaryDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topSourceDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topBinaryDir))
          {
          std::string d = *ri;
          if (!rootPath.empty() && d.find(rootPath) == 0)
            {
            d = d.substr(rootPath.size());
            }
          else if (stagePath && *stagePath && d.find(stagePath) == 0)
            {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
            }
          if(emitted.insert(d).second)
            {
            runtimeDirs.push_back(d);
            }
          }
        }
      }
    }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
  cmGeneratorTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for(std::vector<std::string>::const_iterator li = lc->Languages.begin();
      li != lc->Languages.end(); ++li)
    {
    std::string useVar = "CMAKE_" + *li +
      "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
    if(this->Makefile->IsOn(useVar))
      {
      std::string dirVar = "CMAKE_" + *li +
        "_IMPLICIT_LINK_DIRECTORIES";
      if(const char* dirs = this->Makefile->GetDefinition(dirVar))
        {
        cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}